

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void OPL::DOSBox::DBOPL::InitTables(void)

{
  uint uVar1;
  uint uVar2;
  undefined2 uVar3;
  undefined1 *puVar4;
  int i_2;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  short sVar8;
  int oct;
  int i_3;
  long lVar9;
  char cVar10;
  int i;
  long lVar11;
  short *psVar12;
  int i_1;
  double dVar13;
  
  if (doneTables == '\0') {
    doneTables = '\x01';
    iVar7 = 0xff;
    lVar11 = 0;
    do {
      dVar13 = exp2((double)iVar7 * 0.00390625 + -1.0);
      *(short *)((long)&MulTable + lVar11) = (short)(int)(dVar13 * 65536.0 + 0.5);
      iVar7 = iVar7 + -8;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x300);
    lVar11 = 0;
    do {
      dVar13 = sin(((double)(int)lVar11 + 0.5) * 0.006135923151542565);
      sVar8 = (short)(int)(dVar13 * 4084.0);
      (&DAT_0010b5e0)[lVar11] = sVar8;
      (&WaveTable)[lVar11] = -sVar8;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x200);
    iVar7 = 0xff;
    psVar12 = &DAT_0010bfde;
    lVar11 = 0;
    do {
      dVar13 = exp2((double)iVar7 * 0.00390625 + -1.0);
      sVar8 = (short)(int)(dVar13 * 4085.0 + 0.5);
      (&DAT_0010bfe0)[lVar11] = sVar8;
      *psVar12 = -sVar8;
      uVar3 = WaveTable;
      lVar11 = lVar11 + 1;
      iVar7 = iVar7 + -8;
      psVar12 = psVar12 + -1;
    } while (lVar11 != 0x100);
    lVar11 = 0;
    do {
      (&DAT_0010b9e0)[lVar11] = uVar3;
      (&DAT_0010bbe0)[lVar11] = uVar3;
      (&DAT_0010c3e0)[lVar11] = uVar3;
      (&DAT_0010c9e0)[lVar11] = uVar3;
      (&DAT_0010cbe0)[lVar11] = uVar3;
      (&DAT_0010c1e0)[lVar11] = (&DAT_0010b5e0)[lVar11];
      (&DAT_0010c5e0)[lVar11] = (&DAT_0010b5e0)[lVar11 * 2];
      (&DAT_0010c7e0)[lVar11] = (&WaveTable)[lVar11 * 2];
      (&DAT_0010cde0)[lVar11] = (&DAT_0010b5e0)[lVar11 * 2];
      (&DAT_0010cfe0)[lVar11] = (&DAT_0010b5e0)[lVar11 * 2];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x100);
    puVar4 = &KslTable;
    lVar11 = 0;
    do {
      lVar9 = 0;
      do {
        iVar7 = (int)lVar11 * 8 - (uint)(byte)(&KslCreateTable)[lVar9];
        cVar10 = (char)iVar7;
        if (iVar7 < 1) {
          cVar10 = '\0';
        }
        puVar4[lVar9] = cVar10 << 2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      lVar11 = lVar11 + 1;
      puVar4 = puVar4 + 0x10;
    } while (lVar11 != 8);
    puVar4 = &DAT_0010d663;
    lVar11 = 0;
    do {
      (&TremoloTable)[lVar11] = (char)lVar11;
      *puVar4 = (char)lVar11;
      lVar11 = lVar11 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar11 != 0x1a);
    psVar12 = &ChanOffsetTable;
    uVar5 = 0;
    do {
      uVar6 = (uint)uVar5 & 0xf;
      if (uVar6 < 9) {
        if (uVar6 < 6) {
          uVar6 = uVar6 / 3 + (uVar6 % 3) * 2;
        }
        sVar8 = (short)uVar6 + 9;
        if (uVar5 < 0x10) {
          sVar8 = (short)uVar6;
        }
        sVar8 = sVar8 * 0xf8 + 0x2b8;
      }
      else {
        sVar8 = 0;
      }
      *psVar12 = sVar8;
      uVar5 = uVar5 + 1;
      psVar12 = psVar12 + 1;
    } while (uVar5 != 0x20);
    psVar12 = &OpOffsetTable;
    uVar5 = 0;
    do {
      uVar6 = (uint)uVar5 & 7;
      if ((~(uint)uVar5 & 0x18) == 0 || 5 < uVar6) {
        sVar8 = 0;
      }
      else {
        iVar7 = ((uint)(uVar5 >> 3) & 0x1fffffff) * 3;
        uVar1 = iVar7 + uVar6 % 3;
        uVar2 = iVar7 + 4 + uVar6 % 3;
        if (uVar1 < 0xc) {
          uVar2 = uVar1;
        }
        sVar8 = (short)(uVar6 / 3) * 0x68 + (&ChanOffsetTable)[uVar2];
      }
      *psVar12 = sVar8;
      uVar5 = uVar5 + 1;
      psVar12 = psVar12 + 1;
    } while (uVar5 != 0x40);
  }
  return;
}

Assistant:

void InitTables( void ) {
	if ( doneTables )
		return;
	doneTables = true;
#if ( DBOPL_WAVE == WAVE_HANDLER ) || ( DBOPL_WAVE == WAVE_TABLELOG )
	//Exponential volume table, same as the real adlib
	for ( int i = 0; i < 256; i++ ) {
		//Save them in reverse
		ExpTable[i] = (int)( 0.5 + ( pow(2.0, ( 255 - i) * ( 1.0 /256 ) )-1) * 1024 );
		ExpTable[i] += 1024; //or remove the -1 oh well :)
		//Preshift to the left once so the final volume can shift to the right
		ExpTable[i] *= 2;
	}
#endif
#if ( DBOPL_WAVE == WAVE_HANDLER )
	//Add 0.5 for the trunc rounding of the integer cast
	//Do a PI sinetable instead of the original 0.5 PI
	for ( int i = 0; i < 512; i++ ) {
		SinTable[i] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLEMUL )
	//Multiplication based tables
	for ( int i = 0; i < 384; i++ ) {
		int s = i * 8;
		//TODO maybe keep some of the precision errors of the original table?
		double val = ( 0.5 + ( pow(2.0, -1.0 + ( 255 - s) * ( 1.0 /256 ) )) * ( 1 << MUL_SH ));
		MulTable[i] = (Bit16u)(val);
	}

	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)(sin( (i + 0.5) * (M_PI / 512.0) ) * 4084);
		WaveTable[ 0x0000 + i ] = -WaveTable[ 0x200 + i ];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = (Bit16s)( 0.5 + ( pow(2.0, -1.0 + ( 255 - i * 8) * ( 1.0 /256 ) ) ) * 4085 );
		WaveTable[ 0x6ff - i ] = -WaveTable[ 0x700 + i ];
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLELOG )
	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
		WaveTable[ 0x0000 + i ] = ((Bit16s)0x8000) | WaveTable[ 0x200 + i];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = i * 8;
		WaveTable[ 0x6ff - i ] = ((Bit16s)0x8000) | i * 8;
	}
#endif

	//	|    |//\\|____|WAV7|//__|/\  |____|/\/\|
	//	|\\//|    |    |WAV7|    |  \/|    |    |
	//	|06  |0126|27  |7   |3   |4   |4 5 |5   |

#if (( DBOPL_WAVE == WAVE_TABLELOG ) || ( DBOPL_WAVE == WAVE_TABLEMUL ))
	for ( int i = 0; i < 256; i++ ) {
		//Fill silence gaps
		WaveTable[ 0x400 + i ] = WaveTable[0];
		WaveTable[ 0x500 + i ] = WaveTable[0];
		WaveTable[ 0x900 + i ] = WaveTable[0];
		WaveTable[ 0xc00 + i ] = WaveTable[0];
		WaveTable[ 0xd00 + i ] = WaveTable[0];
		//Replicate sines in other pieces
		WaveTable[ 0x800 + i ] = WaveTable[ 0x200 + i ];
		//double speed sines
		WaveTable[ 0xa00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xb00 + i ] = WaveTable[ 0x000 + i * 2 ];
		WaveTable[ 0xe00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xf00 + i ] = WaveTable[ 0x200 + i * 2 ];
	}
#endif

	//Create the ksl table
	for ( int oct = 0; oct < 8; oct++ ) {
		int base = oct * 8;
		for ( int i = 0; i < 16; i++ ) {
			int val = base - KslCreateTable[i];
			if ( val < 0 )
				val = 0;
			//*4 for the final range to match attenuation range
			KslTable[ oct * 16 + i ] = val * 4;
		}
	}
	//Create the Tremolo table, just increase and decrease a triangle wave
	for ( Bit8u i = 0; i < TREMOLO_TABLE / 2; i++ ) {
		Bit8u val = i << ENV_EXTRA;
		TremoloTable[i] = val;
		TremoloTable[TREMOLO_TABLE - 1 - i] = val;
	}
	//Create a table with offsets of the channels from the start of the chip
	DBOPL::Chip* chip = 0;
	for ( Bitu i = 0; i < 32; i++ ) {
		Bitu index = i & 0xf;
		if ( index >= 9 ) {
			ChanOffsetTable[i] = 0;
			continue;
		}
		//Make sure the four op channels follow eachother
		if ( index < 6 ) {
			index = (index % 3) * 2 + ( index / 3 );
		}
		//Add back the bits for highest ones
		if ( i >= 16 )
			index += 9;
		Bitu blah = reinterpret_cast<size_t>( &(chip->chan[ index ]) );
		ChanOffsetTable[i] = blah;
	}
	//Same for operators
	for ( Bitu i = 0; i < 64; i++ ) {
		if ( i % 8 >= 6 || ( (i / 8) % 4 == 3 ) ) {
			OpOffsetTable[i] = 0;
			continue;
		}
		Bitu chNum = (i / 8) * 3 + (i % 8) % 3;
		//Make sure we use 16 and up for the 2nd range to match the chanoffset gap
		if ( chNum >= 12 )
			chNum += 16 - 12;
		Bitu opNum = ( i % 8 ) / 3;
		DBOPL::Channel* chan = 0;
		Bitu blah = reinterpret_cast<size_t>( &(chan->op[opNum]) );
		OpOffsetTable[i] = ChanOffsetTable[ chNum ] + blah;
	}
#if 0
	//Stupid checks if table's are correct
	for ( Bitu i = 0; i < 18; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i ]) );
		for ( Bitu c = 0; c < 32; c++ ) {
			if ( ChanOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
	for ( Bitu i = 0; i < 36; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i / 2 ].op[i % 2]) );
		for ( Bitu c = 0; c < 64; c++ ) {
			if ( OpOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
#endif
}